

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::get_tess_factor_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar1) {
    pcVar3 = "MTLTriangleTessellationFactorsHalf";
    pcVar2 = "";
  }
  else {
    pcVar3 = "MTLQuadTessellationFactorsHalf";
    pcVar2 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerMSL::get_tess_factor_struct_name()
{
	if (is_tessellating_triangles())
		return "MTLTriangleTessellationFactorsHalf";
	return "MTLQuadTessellationFactorsHalf";
}